

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoCube>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *this)

{
  TPZRegisterClassId *in_RDI;
  void **in_stack_00000008;
  TPZGeoElRefLess<pzgeom::TPZGeoCube> *in_stack_00000010;
  int64_t in_stack_ffffffffffffffb8;
  TPZRefPattern *in_stack_ffffffffffffffd8;
  TPZAutoPointer<TPZRefPattern> *in_stack_ffffffffffffffe0;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefPattern<pzgeom::TPZGeoCube>>(in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_0243e3a8);
  TPZGeoElRefLess<pzgeom::TPZGeoCube>::TPZGeoElRefLess(in_stack_00000010,in_stack_00000008);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefPattern_0243e080;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefPattern_0243e080;
  TPZVec<long>::TPZVec((TPZVec<long> *)(in_RDI + 0x310),in_stack_ffffffffffffffb8);
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8)
  ;
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern():TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),
TPZGeoElRefLess<TGeo>(), fSubEl(0), fRefPattern(0)
{
}